

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O0

Maybe<capnp::DynamicValue::Reader> * __thiscall
capnp::compiler::NodeTranslator::readConstant
          (Maybe<capnp::DynamicValue::Reader> *__return_storage_ptr__,NodeTranslator *this,
          Reader source,bool isBootstrap)

{
  Which WVar1;
  ErrorReporter *pEVar2;
  Resolver *pRVar3;
  SegmentReader *pSVar4;
  CapTableReader *pCVar5;
  void *pvVar6;
  WirePointer *pWVar7;
  Reader RVar8;
  Field field;
  Reader name;
  undefined1 auVar9 [40];
  Reader name_00;
  ImplicitParams implicitMethodParams;
  undefined8 uVar10;
  undefined4 uVar11;
  bool bVar12;
  Which WVar13;
  Type TVar14;
  uint32_t uVar15;
  NullableValue<capnp::compiler::NodeTranslator::BrandedDecl> *other;
  BrandedDecl *pBVar16;
  BrandedDecl *other_00;
  Which *pWVar17;
  uint64_t uVar18;
  NullableValue<capnp::Schema> *pNVar19;
  Schema *pSVar20;
  Schema *pSVar21;
  NullableValue<capnp::schema::Node::Reader> *other_01;
  Reader *pRVar22;
  Reader *__src;
  NullableValue<capnp::StructSchema::Field> *pNVar23;
  Field *pFVar24;
  char (*in_R8) [32];
  Type TVar25;
  ListSchema schema;
  Reader RVar26;
  ArrayPtr<const_char> AVar27;
  undefined4 uVar28;
  undefined4 uVar29;
  undefined8 uVar30;
  String local_9e8;
  String local_9d0;
  ArrayPtr<const_char> local_9b8;
  Reader local_9a8;
  ArrayPtr<const_char> local_978;
  char *pcStack_968;
  StringPtr id_1;
  StringPtr local_938;
  undefined1 local_928 [8];
  StringPtr parent;
  Reader scopeReader;
  Maybe<capnp::Schema> local_8b8;
  undefined1 local_8a8 [8];
  NullableValue<capnp::Schema> scope;
  Fault f;
  ReaderFor<capnp::DynamicList> local_880;
  Reader local_840;
  Schema local_7f8;
  ReaderFor<capnp::DynamicStruct> local_7f0;
  Reader local_7b8;
  Schema local_770;
  undefined1 local_768 [8];
  Type constType;
  Reader objValue;
  Maybe<capnp::StructSchema::Field> local_730;
  undefined1 local_6e8 [8];
  NullableValue<capnp::StructSchema::Field> _kj_result;
  undefined1 local_618 [8];
  Reader constValue;
  undefined1 local_5a0 [8];
  ReaderFor<DynamicTypeFor<FromReader<Reader>_>_> dynamicConst;
  Reader constReader;
  undefined1 local_500 [8];
  NullableValue<capnp::schema::Node::Reader> finalProto;
  Reader proto;
  Maybe<capnp::Schema> local_468;
  undefined1 local_458 [8];
  NullableValue<capnp::Schema> s;
  Schema constSchema;
  uint64_t id;
  Builder constBrand;
  MallocMessageBuilder builder;
  String local_2e8;
  String local_2d0;
  ArrayPtr<const_char> local_2b8;
  Which local_2a6;
  undefined1 local_2a4 [124];
  Maybe<capnp::compiler::NodeTranslator::BrandedDecl> local_228;
  undefined1 local_178 [8];
  NullableValue<capnp::compiler::NodeTranslator::BrandedDecl> decl;
  BrandedDecl constDecl;
  bool isBootstrap_local;
  NodeTranslator *this_local;
  
  BrandedDecl::BrandedDecl
            ((BrandedDecl *)&decl.field_1.value.source._reader.nestingLimit,(void *)0x0);
  RVar8 = source;
  local_2a4._76_8_ = source._reader.segment;
  local_2a4._84_8_ = source._reader.capTable;
  local_2a4._92_8_ = source._reader.data;
  local_2a4._100_8_ = source._reader.pointers;
  local_2a4._108_8_ = source._reader._32_8_;
  local_2a4._116_4_ = source._reader.nestingLimit;
  local_2a4._120_4_ = source._reader._44_4_;
  source = RVar8;
  noImplicitParams();
  RVar8._reader.capTable._0_4_ = (int)local_2a4._84_8_;
  RVar8._reader.segment = (SegmentReader *)local_2a4._76_8_;
  RVar8._reader.capTable._4_4_ = SUB84(local_2a4._84_8_,4);
  RVar8._reader.data._0_4_ = (int)local_2a4._92_8_;
  RVar8._reader.data._4_4_ = SUB84(local_2a4._92_8_,4);
  RVar8._reader.pointers._0_4_ = (int)local_2a4._100_8_;
  RVar8._reader.pointers._4_4_ = SUB84(local_2a4._100_8_,4);
  RVar8._reader.dataSize = (StructDataBitCount)local_2a4._108_8_;
  RVar8._reader._36_4_ = SUB84(local_2a4._108_8_,4);
  RVar8._reader.nestingLimit = (int)local_2a4._116_8_;
  RVar8._reader._44_4_ = SUB84(local_2a4._116_8_,4);
  implicitMethodParams.params.reader.segment = (SegmentReader *)local_2a4._28_8_;
  implicitMethodParams.scopeId = local_2a4._20_8_;
  implicitMethodParams.params.reader.capTable = (CapTableReader *)local_2a4._36_8_;
  implicitMethodParams.params.reader.ptr = (byte *)local_2a4._44_8_;
  implicitMethodParams.params.reader.elementCount = local_2a4._52_4_;
  implicitMethodParams.params.reader.step = local_2a4._56_4_;
  implicitMethodParams.params.reader.structDataSize = local_2a4._60_4_;
  implicitMethodParams.params.reader.structPointerCount = local_2a4._64_2_;
  implicitMethodParams.params.reader.elementSize = local_2a4[0x42];
  implicitMethodParams.params.reader._39_1_ = local_2a4[0x43];
  implicitMethodParams.params.reader._40_8_ = local_2a4._68_8_;
  compileDeclExpression(&local_228,this,RVar8,implicitMethodParams);
  other = kj::_::readMaybe<capnp::compiler::NodeTranslator::BrandedDecl>(&local_228);
  kj::_::NullableValue<capnp::compiler::NodeTranslator::BrandedDecl>::NullableValue
            ((NullableValue<capnp::compiler::NodeTranslator::BrandedDecl> *)local_178,other);
  kj::Maybe<capnp::compiler::NodeTranslator::BrandedDecl>::~Maybe(&local_228);
  pBVar16 = kj::_::NullableValue::operator_cast_to_BrandedDecl_((NullableValue *)local_178);
  if (pBVar16 == (BrandedDecl *)0x0) {
    kj::Maybe<capnp::DynamicValue::Reader>::Maybe(__return_storage_ptr__,(void *)0x0);
    uVar30 = local_2a4._20_8_;
  }
  else {
    other_00 = kj::_::NullableValue<capnp::compiler::NodeTranslator::BrandedDecl>::operator*
                         ((NullableValue<capnp::compiler::NodeTranslator::BrandedDecl> *)local_178);
    BrandedDecl::operator=((BrandedDecl *)&decl.field_1.value.source._reader.nestingLimit,other_00);
    uVar30 = local_2a4._20_8_;
  }
  local_2a4._5_3_ = 0;
  local_2a4[4] = pBVar16 == (BrandedDecl *)0x0;
  kj::_::NullableValue<capnp::compiler::NodeTranslator::BrandedDecl>::~NullableValue
            ((NullableValue<capnp::compiler::NodeTranslator::BrandedDecl> *)local_178);
  if (local_2a4._4_4_ != 0) goto LAB_008fde40;
  BrandedDecl::getKind((BrandedDecl *)local_2a4);
  local_2a6 = FILE;
  pWVar17 = kj::Maybe<capnp::compiler::Declaration::Which>::orDefault
                      ((Maybe<capnp::compiler::Declaration::Which> *)local_2a4,&local_2a6);
  WVar1 = *pWVar17;
  kj::Maybe<capnp::compiler::Declaration::Which>::~Maybe
            ((Maybe<capnp::compiler::Declaration::Which> *)local_2a4);
  if (WVar1 != CONST) {
    pEVar2 = this->errorReporter;
    auVar9 = source._reader._8_40_;
    name._reader._40_8_ = uVar30;
    name._reader.segment = (SegmentReader *)auVar9._0_8_;
    name._reader.capTable = (CapTableReader *)auVar9._8_8_;
    name._reader.data = (void *)auVar9._16_8_;
    name._reader.pointers = (WirePointer *)auVar9._24_8_;
    name._reader.dataSize = auVar9._32_4_;
    name._reader.pointerCount = auVar9._36_2_;
    name._reader._38_2_ = auVar9._38_2_;
    expressionString(name);
    kj::str<char_const(&)[2],kj::String,char_const(&)[32]>
              (&local_2d0,(kj *)0xabe9b4,(char (*) [2])&local_2e8,
               (String *)"\' does not refer to a constant.",in_R8);
    kj::StringPtr::StringPtr((StringPtr *)&local_2b8,&local_2d0);
    ErrorReporter::addErrorOn<capnp::compiler::Expression::Reader&>
              (pEVar2,&source,(StringPtr)local_2b8);
    kj::String::~String(&local_2d0);
    kj::String::~String(&local_2e8);
    kj::Maybe<capnp::DynamicValue::Reader>::Maybe(__return_storage_ptr__,(void *)0x0);
    local_2a4._4_4_ = 1;
    goto LAB_008fde40;
  }
  MallocMessageBuilder::MallocMessageBuilder
            ((MallocMessageBuilder *)&constBrand._builder.dataSize,0x100,GROW_HEURISTICALLY);
  MessageBuilder::getRoot<capnp::schema::Brand>
            ((Builder *)&id,(MessageBuilder *)&constBrand._builder.dataSize);
  constSchema.raw = (RawBrandedSchema *)&id;
  uVar18 = BrandedDecl::
           getIdAndFillBrand<capnp::compiler::NodeTranslator::readConstant(capnp::compiler::Expression::Reader,bool)::__0>
                     ((BrandedDecl *)&decl.field_1.value.source._reader.nestingLimit,
                      (Type *)&constSchema);
  Schema::Schema(&s.field_1.value);
  pRVar3 = this->resolver;
  capnp::schema::Brand::Builder::operator_cast_to_Reader
            ((Reader *)&proto._reader.nestingLimit,(Builder *)&id);
  (*pRVar3->_vptr_Resolver[6])(&local_468,pRVar3,uVar18);
  pNVar19 = kj::_::readMaybe<capnp::Schema>(&local_468);
  kj::_::NullableValue<capnp::Schema>::NullableValue
            ((NullableValue<capnp::Schema> *)local_458,pNVar19);
  kj::Maybe<capnp::Schema>::~Maybe(&local_468);
  pSVar20 = kj::_::NullableValue::operator_cast_to_Schema_((NullableValue *)local_458);
  if (pSVar20 == (Schema *)0x0) {
    kj::Maybe<capnp::DynamicValue::Reader>::Maybe(__return_storage_ptr__,(void *)0x0);
  }
  else {
    pSVar21 = kj::_::NullableValue<capnp::Schema>::operator*
                        ((NullableValue<capnp::Schema> *)local_458);
    s.field_1.value.raw = (Schema)pSVar21->raw;
  }
  local_2a4._5_3_ = 0;
  local_2a4[4] = pSVar20 == (Schema *)0x0;
  kj::_::NullableValue<capnp::Schema>::~NullableValue((NullableValue<capnp::Schema> *)local_458);
  if (local_2a4._4_4_ == 0) {
    Schema::getProto((Reader *)&finalProto.field_1.value._reader.nestingLimit,&s.field_1.value);
    if (!isBootstrap) {
      (*this->resolver->_vptr_Resolver[7])(&constReader._reader.nestingLimit,this->resolver,uVar18);
      other_01 = kj::_::readMaybe<capnp::schema::Node::Reader>
                           ((Maybe<capnp::schema::Node::Reader> *)&constReader._reader.nestingLimit)
      ;
      kj::_::NullableValue<capnp::schema::Node::Reader>::NullableValue
                ((NullableValue<capnp::schema::Node::Reader> *)local_500,other_01);
      kj::Maybe<capnp::schema::Node::Reader>::~Maybe
                ((Maybe<capnp::schema::Node::Reader> *)&constReader._reader.nestingLimit);
      pRVar22 = kj::_::NullableValue::operator_cast_to_Reader_((NullableValue *)local_500);
      if (pRVar22 == (Reader *)0x0) {
        kj::Maybe<capnp::DynamicValue::Reader>::Maybe(__return_storage_ptr__,(void *)0x0);
      }
      else {
        __src = kj::_::NullableValue<capnp::schema::Node::Reader>::operator*
                          ((NullableValue<capnp::schema::Node::Reader> *)local_500);
        memcpy((void *)((long)&finalProto.field_1 + 0x28),__src,0x30);
      }
      local_2a4._5_3_ = 0;
      local_2a4[4] = pRVar22 == (Reader *)0x0;
      kj::_::NullableValue<capnp::schema::Node::Reader>::~NullableValue
                ((NullableValue<capnp::schema::Node::Reader> *)local_500);
      if (local_2a4._4_4_ != 0) goto LAB_008fde20;
    }
    capnp::schema::Node::Reader::getConst
              ((Reader *)&dynamicConst.reader.nestingLimit,
               (Reader *)&finalProto.field_1.value._reader.nestingLimit);
    capnp::schema::Node::Const::Reader::getValue
              ((Reader *)&constValue.field_1.listValue.reader.nestingLimit,
               (Reader *)&dynamicConst.reader.nestingLimit);
    toDynamic<capnp::schema::Value::Reader>
              ((ReaderFor<DynamicTypeFor<FromReader<Reader>_>_> *)local_5a0,
               (Reader *)&constValue.field_1.listValue.reader.nestingLimit);
    DynamicStruct::Reader::which(&local_730,(Reader *)local_5a0);
    pNVar23 = kj::_::readMaybe<capnp::StructSchema::Field>(&local_730);
    kj::_::NullableValue<capnp::StructSchema::Field>::NullableValue
              ((NullableValue<capnp::StructSchema::Field> *)local_6e8,pNVar23);
    kj::Maybe<capnp::StructSchema::Field>::~Maybe(&local_730);
    pFVar24 = kj::_::NullableValue::operator_cast_to_Field_((NullableValue *)local_6e8);
    if (pFVar24 == (Field *)0x0) {
      kj::_::Debug::Fault::Fault
                ((Fault *)&objValue.reader.nestingLimit,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compiler/node-translator.c++"
                 ,0xc3a,FAILED,"dynamicConst.which() != nullptr","");
      kj::_::Debug::Fault::fatal((Fault *)&objValue.reader.nestingLimit);
    }
    pNVar23 = kj::mv<kj::_::NullableValue<capnp::StructSchema::Field>>
                        ((NullableValue<capnp::StructSchema::Field> *)local_6e8);
    kj::_::NullableValue<capnp::StructSchema::Field>::NullableValue
              ((NullableValue<capnp::StructSchema::Field> *)
               &_kj_result.field_1.value.proto._reader.nestingLimit,pNVar23);
    kj::_::NullableValue<capnp::StructSchema::Field>::~NullableValue
              ((NullableValue<capnp::StructSchema::Field> *)local_6e8);
    pFVar24 = kj::_::NullableValue<capnp::StructSchema::Field>::operator*
                        ((NullableValue<capnp::StructSchema::Field> *)
                         &_kj_result.field_1.value.proto._reader.nestingLimit);
    uVar10 = pFVar24->parent;
    uVar11 = pFVar24->index;
    field.index = uVar11;
    field.parent.super_Schema.raw = (Schema)(Schema)uVar10;
    pSVar4 = (pFVar24->proto)._reader.segment;
    pCVar5 = (pFVar24->proto)._reader.capTable;
    pvVar6 = (pFVar24->proto)._reader.data;
    pWVar7 = (pFVar24->proto)._reader.pointers;
    uVar30._0_4_ = (pFVar24->proto)._reader.dataSize;
    uVar30._4_2_ = (pFVar24->proto)._reader.pointerCount;
    uVar30._6_2_ = *(undefined2 *)&(pFVar24->proto)._reader.field_0x26;
    field._12_4_ = (int)((ulong)*(undefined8 *)&pFVar24->index >> 0x20);
    field.proto._reader.segment._0_4_ = (int)pSVar4;
    field.proto._reader.segment._4_4_ = (int)((ulong)pSVar4 >> 0x20);
    field.proto._reader.capTable._0_4_ = (int)pCVar5;
    field.proto._reader.capTable._4_4_ = (int)((ulong)pCVar5 >> 0x20);
    field.proto._reader.data._0_4_ = (int)pvVar6;
    field.proto._reader.data._4_4_ = (int)((ulong)pvVar6 >> 0x20);
    field.proto._reader.pointers._0_4_ = (int)pWVar7;
    field.proto._reader.pointers._4_4_ = (int)((ulong)pWVar7 >> 0x20);
    field.proto._reader.dataSize = (undefined4)uVar30;
    field.proto._reader.pointerCount = uVar30._4_2_;
    field.proto._reader._38_2_ = uVar30._6_2_;
    field.proto._reader.nestingLimit = (pFVar24->proto)._reader.nestingLimit;
    field.proto._reader._44_4_ = *(undefined4 *)&(pFVar24->proto)._reader.field_0x2c;
    DynamicStruct::Reader::get((Reader *)local_618,(Reader *)local_5a0,field);
    kj::_::NullableValue<capnp::StructSchema::Field>::~NullableValue
              ((NullableValue<capnp::StructSchema::Field> *)
               &_kj_result.field_1.value.proto._reader.nestingLimit);
    TVar14 = DynamicValue::Reader::getType((Reader *)local_618);
    if (TVar14 == ANY_POINTER) {
      DynamicValue::Reader::as<capnp::AnyPointer>
                ((ReaderFor<capnp::AnyPointer> *)&constType.field_4,(Reader *)local_618);
      local_770.raw = (RawBrandedSchema *)Schema::asConst(&s.field_1.value);
      TVar25 = ConstSchema::getType((ConstSchema *)&local_770);
      constType._0_8_ = TVar25.field_4;
      local_768 = TVar25._0_8_;
      WVar13 = capnp::Type::which((Type *)local_768);
      if (WVar13 == LIST) {
        schema = capnp::Type::asList((Type *)local_768);
        AnyPointer::Reader::getAs<capnp::DynamicList>
                  (&local_880,(Reader *)&constType.field_4,schema);
        DynamicValue::Reader::Reader(&local_840,&local_880);
        DynamicValue::Reader::operator=((Reader *)local_618,&local_840);
        DynamicValue::Reader::~Reader(&local_840);
      }
      else if (WVar13 == STRUCT) {
        local_7f8.raw = (RawBrandedSchema *)capnp::Type::asStruct((Type *)local_768);
        AnyPointer::Reader::getAs<capnp::DynamicStruct>
                  (&local_7f0,(Reader *)&constType.field_4,(StructSchema)local_7f8.raw);
        DynamicValue::Reader::Reader(&local_7b8,&local_7f0);
        DynamicValue::Reader::operator=((Reader *)local_618,&local_7b8);
        DynamicValue::Reader::~Reader(&local_7b8);
      }
      else if (WVar13 != ANY_POINTER) {
        kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[55]>
                  ((Fault *)&scope.field_1.value,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compiler/node-translator.c++"
                   ,0xc4c,FAILED,(char *)0x0,
                   "\"Unrecognized AnyPointer-typed member of schema::Value.\"",
                   (char (*) [55])"Unrecognized AnyPointer-typed member of schema::Value.");
        kj::_::Debug::Fault::fatal((Fault *)&scope.field_1.value);
      }
    }
    bVar12 = Expression::Reader::isRelativeName(&source);
    if (bVar12) {
      pRVar3 = this->resolver;
      uVar18 = capnp::schema::Node::Reader::getScopeId
                         ((Reader *)&finalProto.field_1.value._reader.nestingLimit);
      scopeReader._reader.nestingLimit = 0;
      scopeReader._reader._44_4_ = 0;
      capnp::schema::Brand::Reader::Reader((Reader *)&scopeReader._reader.nestingLimit);
      (*pRVar3->_vptr_Resolver[6])(&local_8b8,pRVar3,uVar18);
      pNVar19 = kj::_::readMaybe<capnp::Schema>(&local_8b8);
      kj::_::NullableValue<capnp::Schema>::NullableValue
                ((NullableValue<capnp::Schema> *)local_8a8,pNVar19);
      kj::Maybe<capnp::Schema>::~Maybe(&local_8b8);
      pSVar20 = kj::_::NullableValue::operator_cast_to_Schema_((NullableValue *)local_8a8);
      if (pSVar20 != (Schema *)0x0) {
        pSVar20 = kj::_::NullableValue<capnp::Schema>::operator->
                            ((NullableValue<capnp::Schema> *)local_8a8);
        Schema::getProto((Reader *)&parent.content.size_,pSVar20);
        kj::StringPtr::StringPtr((StringPtr *)local_928);
        bVar12 = capnp::schema::Node::Reader::isFile((Reader *)&parent.content.size_);
        if (bVar12) {
          kj::StringPtr::StringPtr(&local_938,"");
          AVar27.size_ = local_938.content.size_;
          AVar27.ptr = local_938.content.ptr;
        }
        else {
          RVar26 = capnp::schema::Node::Reader::getDisplayName((Reader *)&parent.content.size_);
          id_1.content.size_ = RVar26.super_StringPtr.content.ptr;
          uVar15 = capnp::schema::Node::Reader::getDisplayNamePrefixLength
                             ((Reader *)&parent.content.size_);
          AVar27 = (ArrayPtr<const_char>)
                   kj::StringPtr::slice((StringPtr *)&id_1.content.size_,(ulong)uVar15);
        }
        parent.content.ptr = (char *)AVar27.size_;
        local_928 = (undefined1  [8])AVar27.ptr;
        Expression::Reader::getRelativeName(&local_9a8,&source);
        local_978 = (ArrayPtr<const_char>)LocatedText::Reader::getValue(&local_9a8);
        id_1.content.ptr = (char *)local_978.size_;
        pcStack_968 = local_978.ptr;
        pEVar2 = this->errorReporter;
        uVar28 = source._reader.data._0_4_;
        uVar29 = source._reader.data._4_4_;
        auVar9 = source._reader._8_40_;
        name_00._reader._40_8_ = uVar30;
        name_00._reader.segment = (SegmentReader *)auVar9._0_8_;
        name_00._reader.capTable = (CapTableReader *)auVar9._8_8_;
        name_00._reader.data = (void *)auVar9._16_8_;
        name_00._reader.pointers = (WirePointer *)auVar9._24_8_;
        name_00._reader.dataSize = auVar9._32_4_;
        name_00._reader.pointerCount = auVar9._36_2_;
        name_00._reader._38_2_ = auVar9._38_2_;
        expressionString(name_00);
        kj::
        str<char_const(&)[71],kj::String,char_const(&)[9],kj::StringPtr&,char_const(&)[2],kj::StringPtr&,char_const(&)[32]>
                  (&local_9d0,
                   (kj *)"Constant names must be qualified to avoid confusion.  Please replace \'",
                   (char (*) [71])&local_9e8,(String *)"\' with \'",(char (*) [9])local_928,
                   (StringPtr *)0xad0330,(char (*) [2])&pcStack_968,
                   (StringPtr *)"\', if that\'s what you intended.",
                   (char (*) [32])CONCAT44(uVar29,uVar28));
        kj::StringPtr::StringPtr((StringPtr *)&local_9b8,&local_9d0);
        ErrorReporter::addErrorOn<capnp::compiler::Expression::Reader&>
                  (pEVar2,&source,(StringPtr)local_9b8);
        kj::String::~String(&local_9d0);
        kj::String::~String(&local_9e8);
      }
      kj::_::NullableValue<capnp::Schema>::~NullableValue((NullableValue<capnp::Schema> *)local_8a8)
      ;
    }
    kj::Maybe<capnp::DynamicValue::Reader>::Maybe(__return_storage_ptr__,(Reader *)local_618);
    local_2a4._4_4_ = 1;
    DynamicValue::Reader::~Reader((Reader *)local_618);
  }
LAB_008fde20:
  MallocMessageBuilder::~MallocMessageBuilder((MallocMessageBuilder *)&constBrand._builder.dataSize)
  ;
LAB_008fde40:
  BrandedDecl::~BrandedDecl((BrandedDecl *)&decl.field_1.value.source._reader.nestingLimit);
  return __return_storage_ptr__;
}

Assistant:

kj::Maybe<DynamicValue::Reader> NodeTranslator::readConstant(
    Expression::Reader source, bool isBootstrap) {
  // Look up the constant decl.
  NodeTranslator::BrandedDecl constDecl = nullptr;
  KJ_IF_MAYBE(decl, compileDeclExpression(source, noImplicitParams())) {
    constDecl = *decl;
  } else {
    // Lookup will have reported an error.
    return nullptr;
  }

  // Is it a constant?
  if(constDecl.getKind().orDefault(Declaration::FILE) != Declaration::CONST) {
    errorReporter.addErrorOn(source,
        kj::str("'", expressionString(source), "' does not refer to a constant."));
    return nullptr;
  }

  // Extract the ID and brand.
  MallocMessageBuilder builder(256);
  auto constBrand = builder.getRoot<schema::Brand>();
  uint64_t id = constDecl.getIdAndFillBrand([&]() { return constBrand; });

  // Look up the schema -- we'll need this to compile the constant's type.
  Schema constSchema;
  KJ_IF_MAYBE(s, resolver.resolveBootstrapSchema(id, constBrand)) {
    constSchema = *s;
  } else {
    // The constant's schema is broken for reasons already reported.
    return nullptr;
  }

  // If we're bootstrapping, then we know we're expecting a primitive value, so if the
  // constant turns out to be non-primitive, we'll error out anyway.  If we're not
  // bootstrapping, we may be compiling a non-primitive value and so we need the final
  // version of the constant to make sure its value is filled in.
  schema::Node::Reader proto = constSchema.getProto();
  if (!isBootstrap) {
    KJ_IF_MAYBE(finalProto, resolver.resolveFinalSchema(id)) {
      proto = *finalProto;
    } else {
      // The constant's final schema is broken for reasons already reported.
      return nullptr;
    }
  }

  auto constReader = proto.getConst();
  auto dynamicConst = toDynamic(constReader.getValue());
  auto constValue = dynamicConst.get(KJ_ASSERT_NONNULL(dynamicConst.which()));

  if (constValue.getType() == DynamicValue::ANY_POINTER) {
    // We need to assign an appropriate schema to this pointer.
    AnyPointer::Reader objValue = constValue.as<AnyPointer>();

    auto constType = constSchema.asConst().getType();
    switch (constType.which()) {
      case schema::Type::STRUCT:
        constValue = objValue.getAs<DynamicStruct>(constType.asStruct());
        break;
      case schema::Type::LIST:
        constValue = objValue.getAs<DynamicList>(constType.asList());
        break;
      case schema::Type::ANY_POINTER:
        // Fine as-is.
        break;
      default:
        KJ_FAIL_ASSERT("Unrecognized AnyPointer-typed member of schema::Value.");
        break;
    }
  }

  if (source.isRelativeName()) {
    // A fully unqualified identifier looks like it might refer to a constant visible in the
    // current scope, but if that's really what the user wanted, we want them to use a
    // qualified name to make it more obvious.  Report an error.
    KJ_IF_MAYBE(scope, resolver.resolveBootstrapSchema(proto.getScopeId(),
                                                       schema::Brand::Reader())) {
      auto scopeReader = scope->getProto();
      kj::StringPtr parent;
      if (scopeReader.isFile()) {
        parent = "";
      } else {
        parent = scopeReader.getDisplayName().slice(scopeReader.getDisplayNamePrefixLength());
      }
      kj::StringPtr id = source.getRelativeName().getValue();

      errorReporter.addErrorOn(source, kj::str(
          "Constant names must be qualified to avoid confusion.  Please replace '",
          expressionString(source), "' with '", parent, ".", id,
          "', if that's what you intended."));
    }
  }

  return constValue;
}